

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O1

void __thiscall
TEST_TeamCityOutputTest_PrintTestStartedAndEnded_Test::testBody
          (TEST_TeamCityOutputTest_PrintTestStartedAndEnded_Test *this)

{
  TestResult *pTVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).result;
  (*pTVar1->_vptr_TestResult[6])
            (pTVar1,(this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).tst);
  millisTime = 0x2a;
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).result;
  (*pTVar1->_vptr_TestResult[7])
            (pTVar1,(this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).tst);
  pUVar2 = UtestShell::getCurrent();
  pcVar3 = SimpleString::asCharString
                     (&((this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).mock)->output);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,
             "##teamcity[testStarted name=\'test\']\n##teamcity[testFinished name=\'test\' duration=\'42\']\n"
             ,pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
             ,0x6f,pTVar4);
  return;
}

Assistant:

TEST(TeamCityOutputTest, PrintTestStartedAndEnded)
{
    result->currentTestStarted(tst);
    millisTime = 42;
    result->currentTestEnded(tst);
    STRCMP_EQUAL("##teamcity[testStarted name='test']\n##teamcity[testFinished name='test' duration='42']\n",
       mock->getOutput().asCharString());
}